

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsing-utils.c
# Opt level: O1

_Bool str_to_bool(char *string,_Bool *out)

{
  int iVar1;
  _Bool _Var2;
  
  iVar1 = strcasecmp(string,"true");
  _Var2 = true;
  if (iVar1 != 0) {
    iVar1 = strcmp(string,"1");
    _Var2 = true;
    if (iVar1 != 0) {
      iVar1 = strcasecmp(string,"false");
      if (iVar1 == 0) {
        _Var2 = false;
      }
      else {
        iVar1 = strcmp(string,"0");
        _Var2 = false;
        if (iVar1 != 0) {
          return false;
        }
      }
    }
  }
  *out = _Var2;
  return true;
}

Assistant:

bool str_to_bool(const char *string, bool *out) {
    if ((0 == strcasecmp(string, "true")) || (0 == strcmp(string, "1"))) {
        *out = true;
        return true;
    } else if (0 == strcasecmp(string, "false") || (0 == strcmp(string, "0"))) {
        *out = false;
        return true;
    }

    return false;
}